

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

float nk_scrollbar_behavior
                (nk_flags *state,nk_input *in,int has_scrolling,nk_rect *scroll,nk_rect *cursor,
                nk_rect *empty0,nk_rect *empty1,float scroll_offset,float target,float scroll_step,
                nk_orientation o)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  byte bVar17;
  int iVar18;
  bool bVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  nk_flags ws;
  nk_flags local_34;
  float local_30;
  float local_2c;
  
  local_34 = 0;
  *state = *state & 2 | 4;
  if (in == (nk_input *)0x0) {
    return scroll_offset;
  }
  iVar18 = (in->mouse).buttons[0].down;
  uVar1 = cursor->x;
  uVar9 = cursor->y;
  fVar23 = (in->mouse).buttons[0].clicked_pos.x;
  bVar19 = true;
  if (((float)uVar1 <= fVar23) &&
     (uVar2 = cursor->w, uVar10 = cursor->h, fVar23 < (float)uVar1 + (float)uVar2)) {
    fVar23 = (in->mouse).buttons[0].clicked_pos.y;
    bVar19 = iVar18 != 1 || ((float)uVar10 + (float)uVar9 <= fVar23 || fVar23 < (float)uVar9);
  }
  uVar20 = (in->mouse).buttons[0].clicked;
  uVar3 = scroll->x;
  uVar11 = scroll->y;
  fVar23 = (in->mouse).pos.x;
  if (((((float)uVar3 <= fVar23) &&
       (uVar4 = scroll->w, uVar12 = scroll->h, fVar23 < (float)uVar3 + (float)uVar4)) &&
      (fVar23 = (in->mouse).pos.y, (float)uVar11 <= fVar23)) &&
     (fVar23 < (float)uVar11 + (float)uVar12)) {
    *state = 0x12;
  }
  local_30 = (&((nk_vec2 *)((in->mouse).buttons + 5))[1].x)[o == NK_VERTICAL];
  if ((iVar18 == 0 || bVar19) || (uVar20 != 0)) {
    uVar20 = (in->keyboard).keys[0x1d].clicked;
    bVar17 = 1;
    if ((in->keyboard).keys[0x1d].down == 0) {
      if (uVar20 < 2) goto LAB_0013025e;
    }
    else if (uVar20 == 0) {
LAB_0013025e:
      bVar17 = 0;
    }
    if (((bool)(has_scrolling != 0 & o == NK_VERTICAL & bVar17)) ||
       (local_2c = scroll_step, iVar18 = nk_button_behavior(&local_34,*empty0,in,NK_BUTTON_DEFAULT),
       iVar18 != 0)) {
      if (o == NK_VERTICAL) {
        fVar23 = scroll->h;
      }
      else {
        fVar23 = scroll->w;
      }
      fVar22 = scroll_offset - fVar23;
      if (scroll_offset - fVar23 <= 0.0) {
        fVar22 = 0.0;
      }
    }
    else {
      uVar20 = (in->keyboard).keys[0x1c].clicked;
      bVar17 = 1;
      if ((in->keyboard).keys[0x1c].down == 0) {
        if (uVar20 < 2) goto LAB_001303fe;
      }
      else if (uVar20 == 0) {
LAB_001303fe:
        bVar17 = 0;
      }
      if (((bool)(has_scrolling != 0 & o == NK_VERTICAL & bVar17)) ||
         (iVar18 = nk_button_behavior(&local_34,*empty1,in,NK_BUTTON_DEFAULT), iVar18 != 0)) {
        if (o == NK_VERTICAL) {
          fVar23 = scroll->h;
        }
        else {
          fVar23 = scroll->w;
        }
        fVar22 = scroll_offset + fVar23;
        if (target - fVar23 <= scroll_offset + fVar23) {
          fVar22 = target - fVar23;
        }
      }
      else {
        fVar22 = scroll_offset;
        if (has_scrolling != 0) {
          if (local_30 == 0.0) {
            uVar20 = (in->keyboard).keys[0x1a].clicked;
            if ((in->keyboard).keys[0x1a].down == 0) {
              if (uVar20 < 2) goto LAB_001304ec;
            }
            else if (uVar20 == 0) {
LAB_001304ec:
              uVar20 = (in->keyboard).keys[0x1b].clicked;
              bVar17 = 1;
              if ((in->keyboard).keys[0x1b].down == 0) {
                if (uVar20 < 2) goto LAB_00130503;
              }
              else if (uVar20 == 0) {
LAB_00130503:
                bVar17 = 0;
              }
              if (!(bool)(bVar17 ^ 1 | o != NK_VERTICAL)) {
                fVar22 = target - scroll->h;
              }
              goto LAB_0013032d;
            }
            if (o == NK_VERTICAL) {
              fVar22 = 0.0;
            }
          }
          else {
            fVar23 = scroll_offset - local_2c * local_30;
            if (o == NK_VERTICAL) {
              fVar22 = scroll->h;
            }
            else {
              fVar22 = scroll->w;
            }
            if (target - fVar22 <= fVar23) {
              fVar23 = target - fVar22;
            }
            fVar22 = 0.0;
            if (0.0 <= fVar23) {
              fVar22 = fVar23;
            }
          }
        }
      }
    }
  }
  else {
    *state = 0x22;
    if (o == NK_VERTICAL) {
      fVar23 = scroll->h;
      fVar21 = ((in->mouse).delta.y / fVar23) * target + scroll_offset;
      if (target - fVar23 <= fVar21) {
        fVar21 = target - fVar23;
      }
      fVar22 = 0.0;
      if (0.0 <= fVar21) {
        fVar22 = fVar21;
      }
      (in->mouse).buttons[0].clicked_pos.y =
           cursor->h * 0.5 + (fVar22 / target) * fVar23 + scroll->y;
    }
    else {
      fVar23 = scroll->w;
      fVar21 = ((in->mouse).delta.x / fVar23) * target + scroll_offset;
      if (target - fVar23 <= fVar21) {
        fVar21 = target - fVar23;
      }
      fVar22 = 0.0;
      if (0.0 <= fVar21) {
        fVar22 = fVar21;
      }
      (in->mouse).buttons[0].clicked_pos.x =
           cursor->w * 0.5 + (fVar22 / target) * fVar23 + scroll->x;
    }
  }
LAB_0013032d:
  if ((*state & 0x10) != 0) {
    uVar7 = scroll->x;
    uVar15 = scroll->y;
    fVar23 = (in->mouse).prev.x;
    uVar20 = 8;
    if ((((fVar23 < (float)uVar7) ||
         (uVar8 = scroll->w, uVar16 = scroll->h, (float)uVar7 + (float)uVar8 <= fVar23)) ||
        (fVar23 = (in->mouse).prev.y, fVar23 < (float)uVar15)) ||
       ((float)uVar15 + (float)uVar16 <= fVar23)) goto LAB_001303d3;
  }
  uVar5 = scroll->x;
  uVar13 = scroll->y;
  fVar23 = (in->mouse).prev.x;
  if (fVar23 < (float)uVar5) {
    return fVar22;
  }
  uVar6 = scroll->w;
  uVar14 = scroll->h;
  if ((float)uVar5 + (float)uVar6 <= fVar23) {
    return fVar22;
  }
  fVar23 = (in->mouse).prev.y;
  if (fVar23 < (float)uVar13) {
    return fVar22;
  }
  uVar20 = 0x40;
  if ((float)uVar13 + (float)uVar14 <= fVar23) {
    return fVar22;
  }
LAB_001303d3:
  *state = *state | uVar20;
  return fVar22;
}

Assistant:

NK_LIB float
nk_scrollbar_behavior(nk_flags *state, struct nk_input *in,
    int has_scrolling, const struct nk_rect *scroll,
    const struct nk_rect *cursor, const struct nk_rect *empty0,
    const struct nk_rect *empty1, float scroll_offset,
    float target, float scroll_step, enum nk_orientation o)
{
    nk_flags ws = 0;
    int left_mouse_down;
    int left_mouse_clicked;
    int left_mouse_click_in_cursor;
    float scroll_delta;

    nk_widget_state_reset(state);
    if (!in) return scroll_offset;

    left_mouse_down = in->mouse.buttons[NK_BUTTON_LEFT].down;
    left_mouse_clicked = in->mouse.buttons[NK_BUTTON_LEFT].clicked;
    left_mouse_click_in_cursor = nk_input_has_mouse_click_down_in_rect(in,
        NK_BUTTON_LEFT, *cursor, nk_true);
    if (nk_input_is_mouse_hovering_rect(in, *scroll))
        *state = NK_WIDGET_STATE_HOVERED;

    scroll_delta = (o == NK_VERTICAL) ? in->mouse.scroll_delta.y: in->mouse.scroll_delta.x;
    if (left_mouse_down && left_mouse_click_in_cursor && !left_mouse_clicked) {
        /* update cursor by mouse dragging */
        float pixel, delta;
        *state = NK_WIDGET_STATE_ACTIVE;
        if (o == NK_VERTICAL) {
            float cursor_y;
            pixel = in->mouse.delta.y;
            delta = (pixel / scroll->h) * target;
            scroll_offset = NK_CLAMP(0, scroll_offset + delta, target - scroll->h);
            cursor_y = scroll->y + ((scroll_offset/target) * scroll->h);
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.y = cursor_y + cursor->h/2.0f;
        } else {
            float cursor_x;
            pixel = in->mouse.delta.x;
            delta = (pixel / scroll->w) * target;
            scroll_offset = NK_CLAMP(0, scroll_offset + delta, target - scroll->w);
            cursor_x = scroll->x + ((scroll_offset/target) * scroll->w);
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x = cursor_x + cursor->w/2.0f;
        }
    } else if ((nk_input_is_key_pressed(in, NK_KEY_SCROLL_UP) && o == NK_VERTICAL && has_scrolling)||
            nk_button_behavior(&ws, *empty0, in, NK_BUTTON_DEFAULT)) {
        /* scroll page up by click on empty space or shortcut */
        if (o == NK_VERTICAL)
            scroll_offset = NK_MAX(0, scroll_offset - scroll->h);
        else scroll_offset = NK_MAX(0, scroll_offset - scroll->w);
    } else if ((nk_input_is_key_pressed(in, NK_KEY_SCROLL_DOWN) && o == NK_VERTICAL && has_scrolling) ||
        nk_button_behavior(&ws, *empty1, in, NK_BUTTON_DEFAULT)) {
        /* scroll page down by click on empty space or shortcut */
        if (o == NK_VERTICAL)
            scroll_offset = NK_MIN(scroll_offset + scroll->h, target - scroll->h);
        else scroll_offset = NK_MIN(scroll_offset + scroll->w, target - scroll->w);
    } else if (has_scrolling) {
        if ((scroll_delta < 0 || (scroll_delta > 0))) {
            /* update cursor by mouse scrolling */
            scroll_offset = scroll_offset + scroll_step * (-scroll_delta);
            if (o == NK_VERTICAL)
                scroll_offset = NK_CLAMP(0, scroll_offset, target - scroll->h);
            else scroll_offset = NK_CLAMP(0, scroll_offset, target - scroll->w);
        } else if (nk_input_is_key_pressed(in, NK_KEY_SCROLL_START)) {
            /* update cursor to the beginning  */
            if (o == NK_VERTICAL) scroll_offset = 0;
        } else if (nk_input_is_key_pressed(in, NK_KEY_SCROLL_END)) {
            /* update cursor to the end */
            if (o == NK_VERTICAL) scroll_offset = target - scroll->h;
        }
    }
    if (*state & NK_WIDGET_STATE_HOVER && !nk_input_is_mouse_prev_hovering_rect(in, *scroll))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(in, *scroll))
        *state |= NK_WIDGET_STATE_LEFT;
    return scroll_offset;
}